

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O3

ze_result_t
loader::zetMetricStreamerOpen
          (zet_context_handle_t hContext,zet_device_handle_t hDevice,
          zet_metric_group_handle_t hMetricGroup,zet_metric_streamer_desc_t *desc,
          ze_event_handle_t hNotificationEvent,zet_metric_streamer_handle_t *phMetricStreamer)

{
  zet_pfnMetricStreamerOpen_t p_Var1;
  ze_result_t zVar2;
  object_t<_zet_metric_streamer_handle_t_*> *poVar3;
  ze_event_handle_t p_Var4;
  dditable_t *dditable;
  dditable_t *local_10;
  
  local_10 = *(dditable_t **)(hContext + 8);
  p_Var1 = (local_10->zet).MetricStreamer.pfnOpen;
  if (p_Var1 == (zet_pfnMetricStreamerOpen_t)0x0) {
    zVar2 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    if (hNotificationEvent == (ze_event_handle_t)0x0) {
      p_Var4 = (ze_event_handle_t)0x0;
    }
    else {
      p_Var4 = *(ze_event_handle_t *)hNotificationEvent;
    }
    zVar2 = (*p_Var1)(*(zet_context_handle_t *)hContext,*(zet_device_handle_t *)hDevice,
                      *(zet_metric_group_handle_t *)hMetricGroup,desc,p_Var4,phMetricStreamer);
    if (zVar2 == ZE_RESULT_SUCCESS) {
      poVar3 = singleton_factory_t<object_t<_zet_metric_streamer_handle_t*>,_zet_metric_streamer_handle_t*>
               ::getInstance<_zet_metric_streamer_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_zet_metric_streamer_handle_t*>,_zet_metric_streamer_handle_t*>
                           *)(context + 0x1380),phMetricStreamer,&local_10);
      *phMetricStreamer = (zet_metric_streamer_handle_t)poVar3;
      zVar2 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar2;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricStreamerOpen(
        zet_context_handle_t hContext,                  ///< [in] handle of the context object
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        zet_metric_group_handle_t hMetricGroup,         ///< [in] handle of the metric group
        zet_metric_streamer_desc_t* desc,               ///< [in,out] metric streamer descriptor
        ze_event_handle_t hNotificationEvent,           ///< [in][optional] event used for report availability notification
        zet_metric_streamer_handle_t* phMetricStreamer  ///< [out] handle of metric streamer
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_context_object_t*>( hContext )->dditable;
        auto pfnOpen = dditable->zet.MetricStreamer.pfnOpen;
        if( nullptr == pfnOpen )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hContext = reinterpret_cast<zet_context_object_t*>( hContext )->handle;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<zet_device_object_t*>( hDevice )->handle;

        // convert loader handle to driver handle
        hMetricGroup = reinterpret_cast<zet_metric_group_object_t*>( hMetricGroup )->handle;

        // convert loader handle to driver handle
        hNotificationEvent = ( hNotificationEvent ) ? reinterpret_cast<ze_event_object_t*>( hNotificationEvent )->handle : nullptr;

        // forward to device-driver
        result = pfnOpen( hContext, hDevice, hMetricGroup, desc, hNotificationEvent, phMetricStreamer );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phMetricStreamer = reinterpret_cast<zet_metric_streamer_handle_t>(
                context->zet_metric_streamer_factory.getInstance( *phMetricStreamer, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }